

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void __thiscall
FunctionSymbol::FunctionSymbol
          (FunctionSymbol *this,int lexemeIndex,int scope,char *lexemeScope,TypeNode *returnType,
          bool pointer,FormalListNode *varDecl)

{
  (this->super_Symbol).lexemeIndex = lexemeIndex;
  (this->super_Symbol).lexemeScope = lexemeScope;
  (this->super_Symbol).scope = scope;
  (this->super_Symbol).nextSymbol = (Symbol *)0x0;
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR__FunctionSymbol_00124150;
  this->returnType = returnType;
  this->pointer = pointer;
  this->varDecl = varDecl;
  this->localSize = 0;
  this->paramSize = 0;
  this->callSize = 0;
  return;
}

Assistant:

FunctionSymbol::FunctionSymbol(int lexemeIndex, int scope, const char *lexemeScope, TypeNode *returnType,
                               bool pointer, FormalListNode *varDecl) : Symbol(lexemeIndex, scope, lexemeScope) {
    this->returnType = returnType;
    this->pointer = pointer;
    this->varDecl = varDecl;

    this->localSize = 0;
    this->paramSize = 0;
    this->callSize = 0;
}